

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cws.c
# Opt level: O1

void nn_cws_start_resolving(nn_cws *self)

{
  char *addr;
  int ipv4only;
  size_t ipv4onlylen;
  int local_1c;
  size_t local_18;
  
  local_18 = 4;
  nn_ep_getopt(self->ep,0,0xe,&local_1c,&local_18);
  if (local_18 == 4) {
    addr = (char *)nn_chunkref_data(&self->remote_host);
    if (*addr != '\0') {
      nn_dns_start(&self->dns,addr,self->remote_hostname_len,local_1c,&self->dns_result);
      self->state = 2;
      return;
    }
  }
  else {
    nn_cws_start_resolving_cold_1();
  }
  nn_cws_start_resolving_cold_2();
}

Assistant:

static void nn_cws_start_resolving (struct nn_cws *self)
{
    int ipv4only;
    size_t ipv4onlylen;
    char *host;

    /*  Check whether IPv6 is to be used. */
    ipv4onlylen = sizeof (ipv4only);
    nn_ep_getopt (self->ep, NN_SOL_SOCKET, NN_IPV4ONLY,
        &ipv4only, &ipv4onlylen);
    nn_assert (ipv4onlylen == sizeof (ipv4only));

    host = nn_chunkref_data (&self->remote_host);
    nn_assert (strlen (host) > 0);

    nn_dns_start (&self->dns, host, self->remote_hostname_len, ipv4only,
        &self->dns_result);

    self->state = NN_CWS_STATE_RESOLVING;
}